

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mysimulator.cc
# Opt level: O3

void __thiscall brown::MySimulator::hardwareLoop(MySimulator *this)

{
  bool bVar1;
  bool bVar2;
  Timer *pTVar3;
  Timer *pTVar4;
  _func_void_Timer_ptr_Simulator_ptr *p_Var5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  pTVar3 = this->timx;
  pTVar4 = this->timy;
  bVar1 = pTVar3->isRunning;
  bVar2 = pTVar4->isRunning;
  if ((bVar1 | bVar2) == 1) {
    uVar6 = (ulong)((pTVar3->prescaler + 1) * pTVar3->period);
    lVar7 = this->cx;
    lVar10 = uVar6 - lVar7;
    lVar8 = (ulong)((pTVar4->prescaler + 1) * pTVar4->period) - this->cy;
    lVar9 = lVar10;
    if (lVar8 < lVar10) {
      lVar9 = lVar8;
    }
    if (bVar2 == false) {
      lVar9 = lVar10;
    }
    if (bVar1 != false) {
      lVar7 = lVar7 + lVar9;
      this->cx = lVar7;
      lVar8 = lVar9;
    }
    if (bVar2 != false) {
      this->cy = this->cy + lVar8;
    }
    lVar8 = lVar8 + this->clk;
    this->clk = lVar8;
    if ((bVar1 != false) && ((long)uVar6 <= lVar7)) {
      Simulator::setpin(&this->super_Simulator,lVar8,true,false,this->dirx,this->diry,this->isDown);
      p_Var5 = this->timx->cb;
      if (p_Var5 != (_func_void_Timer_ptr_Simulator_ptr *)0x0) {
        (*p_Var5)(this->timx,&this->super_Simulator);
      }
      this->cx = 0;
    }
    if ((bVar2 != false) &&
       ((long)(ulong)((this->timy->prescaler + 1) * this->timy->period) <= this->cy)) {
      Simulator::setpin(&this->super_Simulator,this->clk,false,true,this->dirx,this->diry,
                        this->isDown);
      p_Var5 = this->timy->cb;
      if (p_Var5 != (_func_void_Timer_ptr_Simulator_ptr *)0x0) {
        (*p_Var5)(this->timy,&this->super_Simulator);
      }
      this->cy = 0;
    }
  }
  return;
}

Assistant:

void MySimulator::hardwareLoop() {
    bool xr = timx.running();
    bool yr = timy.running();
    if (!xr && !yr) {return;}
    std::int64_t tx = static_cast<std::int64_t>(timx.t()) - cx;
    std::int64_t ty = static_cast<std::int64_t>(timy.t()) - cy;
    std::int64_t dt = (xr && yr) ? std::min(tx, ty) : (xr ? tx : ty);
    if (xr) {cx += dt;}
    if (yr) {cy += dt;}
    clk += dt;

    if (xr && (cx >= timx.t())) {
        setpin(clk, true, false, dirx, diry, isDown);
        timx.callback(*this);
        cx = 0;
    }
    if (yr && (cy >= timy.t())) {
        setpin(clk, false, true, dirx, diry, isDown);
        timy.callback(*this);
        cy = 0;
    }
}